

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[2],kj::StringPtr_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],StringPtr *params_1)

{
  ArrayPtr<const_char> local_38;
  kj *local_28;
  size_t local_20;
  
  local_20 = strlen((char *)this);
  local_38.ptr = *(char **)params;
  local_38.size_ = *(long *)(params + 4) + -1;
  local_28 = this;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,(ArrayPtr<const_char> *)local_38.size_)
  ;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}